

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

uint8 * __thiscall
sentencepiece::NBestSentencePieceText::_InternalSerialize
          (NBestSentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  SentencePieceText *this_00;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  int iVar9;
  undefined8 *puVar10;
  size_t __n;
  
  iVar1 = (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (SentencePieceText *)
                ((this->nbests_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\n';
      uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar7 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar7 = target + 3;
        }
        else {
          puVar7 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar8 = puVar7;
            puVar8[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar7 = puVar8 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar4);
          *puVar8 = (uint8)uVar6;
        }
      }
      target = SentencePieceText::_InternalSerialize(this_00,puVar7,stream);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    pvVar2 = *(void **)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
    pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,(int)puVar10[1],target);
      return puVar7;
    }
    memcpy(target,pvVar2,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NBestSentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SentencePieceText nbests = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nbests_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_nbests(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NBestSentencePieceText)
  return target;
}